

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O0

char * max_expand(MatchState *ms,char *s,char *p,char *ep)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *res;
  ptrdiff_t i;
  char *ep_local;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  res = (char *)0x0;
  while( true ) {
    bVar3 = false;
    if (s + (long)res < ms->src_end) {
      iVar1 = singlematch((uint)(byte)s[(long)res],p,ep);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    res = res + 1;
  }
  while( true ) {
    if ((long)res < 0) {
      return (char *)0x0;
    }
    pcVar2 = match(ms,s + (long)res,ep + 1);
    if (pcVar2 != (char *)0x0) break;
    res = res + -1;
  }
  return pcVar2;
}

Assistant:

static const char *max_expand (MatchState *ms, const char *s,
                                 const char *p, const char *ep) {
  ptrdiff_t i = 0;  /* counts maximum expand for item */
  while ((s+i)<ms->src_end && singlematch(uchar(*(s+i)), p, ep))
    i++;
  /* keeps trying to match with the maximum repetitions */
  while (i>=0) {
    const char *res = match(ms, (s+i), ep+1);
    if (res) return res;
    i--;  /* else didn't match; reduce 1 repetition to try again */
  }
  return NULL;
}